

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::StreamingReporterBase::testRunEnded(StreamingReporterBase *this,TestRunStats *param_1)

{
  LazyStat<Catch::TestCaseInfo>::reset(&this->currentTestCaseInfo);
  LazyStat<Catch::GroupInfo>::reset(&this->currentGroupInfo);
  LazyStat<Catch::TestRunInfo>::reset(&this->currentTestRunInfo);
  return;
}

Assistant:

virtual void testRunEnded( TestRunStats const& /* _testRunStats */ ) {
            currentTestCaseInfo.reset();
            currentGroupInfo.reset();
            currentTestRunInfo.reset();
        }